

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

void lore_append_spells(textblock *tb,monster_race *race,monster_lore_conflict *lore,
                       bitflag *known_flags)

{
  bool bVar1;
  bool bVar2;
  monster_race *pmVar3;
  _Bool know_hp_00;
  _Bool _Var4;
  monster_sex_t sex;
  int iVar5;
  char *pcVar6;
  int local_70;
  int local_6c;
  wchar_t approx_frequency_1;
  wchar_t approx_frequency;
  monster_race *old_ref;
  bitflag test_flags [12];
  bitflag current_flags [12];
  _Bool know_hp;
  char *initial_pronoun;
  _Bool breath;
  _Bool innate;
  monster_sex_t msex;
  bitflag *known_flags_local;
  monster_lore_conflict *lore_local;
  monster_race *race_local;
  textblock *tb_local;
  
  pmVar3 = ref_race;
  bVar2 = false;
  if (((tb != (textblock *)0x0) && (race != (monster_race *)0x0)) &&
     (lore != (monster_lore_conflict *)0x0)) {
    know_hp_00 = (_Bool)(lore->armour_known & 1);
    ref_race = race;
    sex = lore_monster_sex(race);
    pcVar6 = lore_pronoun_nominative(sex,true);
    create_mon_spell_mask(test_flags + 4,0x800,0);
    flag_inter(test_flags + 4,lore->spell_flags,0xc);
    create_mon_spell_mask((bitflag *)((long)&old_ref + 7),4,0);
    flag_diff(test_flags + 4,(bitflag *)((long)&old_ref + 7),0xc);
    _Var4 = flag_is_empty(test_flags + 4,0xc);
    bVar1 = !_Var4;
    if (bVar1) {
      textblock_append(tb,"%s may ",pcVar6);
      lore_append_spell_clause(tb,test_flags + 4,know_hp_00,race,"or","");
    }
    create_mon_spell_mask(test_flags + 4,4,0);
    flag_inter(test_flags + 4,lore->spell_flags,0xc);
    _Var4 = flag_is_empty(test_flags + 4,0xc);
    if (!_Var4) {
      if (bVar1) {
        textblock_append(tb,", and may ");
      }
      else {
        textblock_append(tb,"%s may ",pcVar6);
      }
      textblock_append_c(tb,'\f',"breathe ");
      lore_append_spell_clause(tb,test_flags + 4,know_hp_00,race,"or","");
      bVar2 = true;
    }
    if (((bVar1) || (bVar2)) && (race->freq_innate != L'\0')) {
      if ((lore->innate_freq_known & 1U) == 0) {
        if (lore->cast_innate != '\0') {
          iVar5 = race->freq_innate + L'\t';
          if ((iVar5 / 10) * 10 < 1) {
            local_6c = 1;
          }
          else {
            iVar5 = race->freq_innate + L'\t';
            local_6c = (iVar5 / 10) * 10;
          }
          textblock_append(tb,"; about ",(long)iVar5 % 10 & 0xffffffff);
          textblock_append_c(tb,'\r',"1");
          textblock_append(tb," time in ");
          textblock_append_c(tb,'\r',"%d",100 / (long)local_6c & 0xffffffff);
        }
      }
      else {
        textblock_append(tb,"; ");
        textblock_append_c(tb,'\r',"1");
        textblock_append(tb," time in ");
        textblock_append_c(tb,'\r',"%d",100 / (long)race->freq_innate & 0xffffffff);
      }
      textblock_append(tb,".  ");
    }
    flag_copy(test_flags + 4,lore->spell_flags,0xc);
    create_mon_spell_mask((bitflag *)((long)&old_ref + 7),4,0x800,0);
    flag_diff(test_flags + 4,(bitflag *)((long)&old_ref + 7),0xc);
    _Var4 = flag_is_empty(test_flags + 4,0xc);
    if (!_Var4) {
      textblock_append(tb,"%s may ",pcVar6);
      textblock_append_c(tb,'\f',"cast spells");
      _Var4 = flag_has_dbg(known_flags,0xb,0x1a,"known_flags","RF_SMART");
      if (_Var4) {
        textblock_append(tb," intelligently");
      }
      textblock_append(tb," which ");
      lore_append_spell_clause(tb,test_flags + 4,know_hp_00,race,"or","");
      if (race->freq_spell != L'\0') {
        if ((lore->spell_freq_known & 1U) == 0) {
          if (lore->cast_spell != '\0') {
            iVar5 = race->freq_spell + L'\t';
            if ((iVar5 / 10) * 10 < 1) {
              local_70 = 1;
            }
            else {
              iVar5 = race->freq_spell + L'\t';
              local_70 = (iVar5 / 10) * 10;
            }
            textblock_append(tb,"; about ",(long)iVar5 % 10 & 0xffffffff);
            textblock_append_c(tb,'\r',"1");
            textblock_append(tb," time in ");
            textblock_append_c(tb,'\r',"%d",100 / (long)local_70 & 0xffffffff);
          }
        }
        else {
          textblock_append(tb,"; ");
          textblock_append_c(tb,'\r',"1");
          textblock_append(tb," time in ");
          textblock_append_c(tb,'\r',"%d",100 / (long)race->freq_spell & 0xffffffff);
        }
      }
      textblock_append(tb,".  ");
    }
    ref_race = pmVar3;
    return;
  }
  __assert_fail("tb && race && lore",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-lore.c"
                ,0x5df,
                "void lore_append_spells(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
               );
}

Assistant:

void lore_append_spells(textblock *tb, const struct monster_race *race,
						const struct monster_lore *lore,
						bitflag known_flags[RF_SIZE])
{
	monster_sex_t msex = MON_SEX_NEUTER;
	bool innate = false;
	bool breath = false;
	const char *initial_pronoun;
	bool know_hp;
	bitflag current_flags[RSF_SIZE], test_flags[RSF_SIZE];
	const struct monster_race *old_ref;

	assert(tb && race && lore);

	/* Set the race for expressions in the spells. */
	old_ref = ref_race;
	ref_race = race;

	know_hp = lore->armour_known;

	/* Extract a gender (if applicable) and get a pronoun for the start of
	 * sentences */
	msex = lore_monster_sex(race);
	initial_pronoun = lore_pronoun_nominative(msex, true);

	/* Collect innate (non-breath) attacks */
	create_mon_spell_mask(current_flags, RST_INNATE, RST_NONE);
	rsf_inter(current_flags, lore->spell_flags);
	create_mon_spell_mask(test_flags, RST_BREATH, RST_NONE);
	rsf_diff(current_flags, test_flags);
	if (!rsf_is_empty(current_flags)) {
		textblock_append(tb, "%s may ", initial_pronoun);
		lore_append_spell_clause(tb, current_flags, know_hp, race, "or", "");
		innate = true;
	}

	/* Collect breaths */
	create_mon_spell_mask(current_flags, RST_BREATH, RST_NONE);
	rsf_inter(current_flags, lore->spell_flags);
	if (!rsf_is_empty(current_flags)) {
		if (innate) {
			textblock_append(tb, ", and may ");
		} else {
			textblock_append(tb, "%s may ", initial_pronoun);
		}
		textblock_append_c(tb, COLOUR_L_RED, "breathe ");
		lore_append_spell_clause(tb, current_flags, know_hp, race, "or", "");
		breath = true;
	}

	/* End the sentence about innate spells and breaths */
	if ((innate || breath) && race->freq_innate) {
		if (lore->innate_freq_known) {
			/* Describe the spell frequency */
			textblock_append(tb, "; ");
			textblock_append_c(tb, COLOUR_L_GREEN, "1");
			textblock_append(tb, " time in ");
			textblock_append_c(tb, COLOUR_L_GREEN, "%d",
							   100 / race->freq_innate);
		} else if (lore->cast_innate) {
			/* Guess at the frequency */
			int approx_frequency = MAX(((race->freq_innate + 9) / 10) * 10, 1);
			textblock_append(tb, "; about ");
			textblock_append_c(tb, COLOUR_L_GREEN, "1");
			textblock_append(tb, " time in ");
			textblock_append_c(tb, COLOUR_L_GREEN, "%d",
							   100 / approx_frequency);
		}

		textblock_append(tb, ".  ");
	}

	/* Collect spell information */
	rsf_copy(current_flags, lore->spell_flags);
	create_mon_spell_mask(test_flags, RST_BREATH, RST_INNATE, RST_NONE);
	rsf_diff(current_flags, test_flags);
	if (!rsf_is_empty(current_flags)) {
		/* Intro */
		textblock_append(tb, "%s may ", initial_pronoun);

		/* Verb Phrase */
		textblock_append_c(tb, COLOUR_L_RED, "cast spells");

		/* Adverb */
		if (rf_has(known_flags, RF_SMART))
			textblock_append(tb, " intelligently");

		/* List */
		textblock_append(tb, " which ");
		lore_append_spell_clause(tb, current_flags, know_hp, race, "or", "");

		/* End the sentence about innate/other spells */
		if (race->freq_spell) {
			if (lore->spell_freq_known) {
				/* Describe the spell frequency */
				textblock_append(tb, "; ");
				textblock_append_c(tb, COLOUR_L_GREEN, "1");
				textblock_append(tb, " time in ");
				textblock_append_c(tb, COLOUR_L_GREEN, "%d",
								   100 / race->freq_spell);
			} else if (lore->cast_spell) {
				/* Guess at the frequency */
				int approx_frequency = MAX(((race->freq_spell + 9) / 10) * 10,
										   1);
				textblock_append(tb, "; about ");
				textblock_append_c(tb, COLOUR_L_GREEN, "1");
				textblock_append(tb, " time in ");
				textblock_append_c(tb, COLOUR_L_GREEN, "%d",
								   100 / approx_frequency);
			}
		}

		textblock_append(tb, ".  ");
	}

	/* Restore the previous reference. */
	ref_race = old_ref;
}